

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Routines_Disasm.c
# Opt level: O0

size_t printArg(OPTYPE *pMyOperand,PDISASM pMyDisasm,size_t i)

{
  size_t sVar1;
  size_t sVar2;
  size_t mnemonic;
  size_t i_local;
  PDISASM pMyDisasm_local;
  OPTYPE *pMyOperand_local;
  
  sVar1 = strlen(pMyOperand->OpMnemonic);
  mnemonic = i;
  if (sVar1 != 0) {
    sVar2 = printOneSpace(pMyDisasm,i);
    strcpy(pMyDisasm->CompleteInstr + sVar2,pMyOperand->OpMnemonic);
    mnemonic = strlen(pMyDisasm->CompleteInstr);
  }
  return mnemonic;
}

Assistant:

size_t __bea_callspec__ printArg(OPTYPE* pMyOperand, PDISASM pMyDisasm, size_t i)
{
  size_t mnemonic = strlen((char*) &pMyOperand->OpMnemonic);
  if (mnemonic != 0) {
    i = printOneSpace(pMyDisasm, i);
    (void) strcpy ((char*) &pMyDisasm->CompleteInstr+i, (char*) &pMyOperand->OpMnemonic);
    i = strlen((char*) &pMyDisasm->CompleteInstr);
  }
  return i;
}